

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  uint32 first_byte_or_zero;
  int64 iVar5;
  ulong uVar6;
  int *piVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int value;
  ulong unaff_R13;
  bool bVar14;
  
  pbVar8 = input->buffer_;
  if (pbVar8 < input->buffer_end_) {
    uVar13 = (uint)*pbVar8;
    if (-1 < (char)*pbVar8) {
      input->buffer_ = pbVar8 + 1;
      bVar14 = true;
      goto LAB_001835b5;
    }
  }
  else {
    uVar13 = 0;
  }
  iVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar13);
  uVar13 = (uint)iVar5;
  bVar14 = -1 < iVar5;
LAB_001835b5:
  if (bVar14) {
    limit = io::CodedInputStream::PushLimit(input,uVar13);
    uVar13 = field_number << 3;
    do {
      iVar4 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar4 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar8 = input->buffer_;
      if (pbVar8 < input->buffer_end_) {
        bVar1 = *pbVar8;
        uVar6 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00183618;
        input->buffer_ = pbVar8 + 1;
        bVar14 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_00183618:
        uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar14 = -1 < (long)uVar6;
      }
      uVar2 = unaff_R13;
      if (bVar14) {
        uVar2 = uVar6;
      }
      unaff_R13 = uVar2 & 0xffffffff;
      if (!bVar14) {
        return false;
      }
      uVar11 = (uint)uVar2;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar3 = (*is_valid)(uVar11), bVar3)) {
        uVar12 = values->current_size_;
        if (uVar12 == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        piVar7 = RepeatedField<int>::elements(values);
        piVar7[uVar12] = uVar11;
        values->current_size_ = uVar12 + 1;
      }
      else {
        pbVar8 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar8) {
          pbVar8 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar8);
        }
        unknown_fields_stream->cur_ = pbVar8;
        if (uVar13 < 0x80) {
          *pbVar8 = (byte)uVar13;
          pbVar8 = pbVar8 + 1;
        }
        else {
          *pbVar8 = (byte)uVar13 | 0x80;
          if (uVar13 < 0x4000) {
            pbVar8[1] = (byte)(uVar13 >> 7);
            pbVar8 = pbVar8 + 2;
          }
          else {
            pbVar8 = pbVar8 + 2;
            uVar12 = uVar13 >> 7;
            do {
              pbVar9 = pbVar8;
              pbVar9[-1] = (byte)uVar12 | 0x80;
              uVar10 = uVar12 >> 7;
              pbVar8 = pbVar9 + 1;
              bVar3 = 0x3fff < uVar12;
              uVar12 = uVar10;
            } while (bVar3);
            *pbVar9 = (byte)uVar10;
          }
        }
        unknown_fields_stream->cur_ = pbVar8;
        if ((unknown_fields_stream->impl_).end_ <= pbVar8) {
          pbVar8 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar8);
        }
        unknown_fields_stream->cur_ = pbVar8;
        if (uVar11 < 0x80) {
          *pbVar8 = (byte)unaff_R13;
          pbVar8 = pbVar8 + 1;
        }
        else {
          *pbVar8 = (byte)unaff_R13 | 0x80;
          uVar6 = unaff_R13 >> 7;
          if (uVar11 < 0x4000) {
            pbVar8[1] = (byte)uVar6;
            pbVar8 = pbVar8 + 2;
          }
          else {
            pbVar8 = pbVar8 + 2;
            do {
              pbVar9 = pbVar8;
              uVar11 = (uint)uVar6;
              pbVar9[-1] = (byte)uVar6 | 0x80;
              uVar12 = uVar11 >> 7;
              uVar6 = (ulong)uVar12;
              pbVar8 = pbVar9 + 1;
            } while (0x3fff < uVar11);
            *pbVar9 = (byte)uVar12;
          }
        }
        unknown_fields_stream->cur_ = pbVar8;
      }
    } while (bVar14);
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}